

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.cpp
# Opt level: O3

void __thiscall FS::Focuser::doSStatus(Focuser *this,CommandPacket cp)

{
  DebugInterface *pDVar1;
  NetInterface *pNVar2;
  char *pcVar3;
  
  pDVar1 = (this->debugLog)._M_t.
           super___uniq_ptr_impl<DebugInterface,_std::default_delete<DebugInterface>_>._M_t.
           super__Tuple_impl<0UL,_DebugInterface_*,_std::default_delete<DebugInterface>_>.
           super__Head_base<0UL,_DebugInterface_*,_false>._M_head_impl;
  (**pDVar1->_vptr_DebugInterface)(pDVar1,"Processing sstatus request\n",0x1b);
  pNVar2 = (this->net)._M_t.super___uniq_ptr_impl<NetInterface,_std::default_delete<NetInterface>_>.
           _M_t.super__Tuple_impl<0UL,_NetInterface_*,_std::default_delete<NetInterface>_>.
           super__Head_base<0UL,_NetInterface_*,_false>._M_head_impl;
  (*pNVar2->_vptr_NetInterface[4])(pNVar2,"Synched: ",9);
  pcVar3 = "NO";
  if ((ulong)this->isSynched != 0) {
    pcVar3 = "YES";
  }
  (*pNVar2->_vptr_NetInterface[4])(pNVar2,pcVar3,(ulong)this->isSynched | 2);
  (*pNVar2->_vptr_NetInterface[4])(pNVar2,"\n",1);
  return;
}

Assistant:

void Focuser::doSStatus( CommandParser::CommandPacket cp )
{
  (void) cp;
  DebugInterface& log = *debugLog;

  log << "Processing sstatus request\n";
  *net << "Synched: " << (isSynched ? "YES" : "NO" ) << "\n";
}